

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O3

bool llvm::convertWideToUTF8(wstring *Source,string *Result)

{
  pointer sourceEnd;
  ConversionResult CVar1;
  UTF8 *ResultPtr;
  UTF32 *Start;
  UTF8 *local_30;
  pointer local_28;
  
  local_28 = (Source->_M_dataplus)._M_p;
  sourceEnd = local_28 + Source->_M_string_length;
  std::__cxx11::string::resize((ulong)Result,(char)(Source->_M_string_length << 2));
  local_30 = (UTF8 *)(Result->_M_dataplus)._M_p;
  CVar1 = ConvertUTF32toUTF8((UTF32 **)&local_28,(UTF32 *)sourceEnd,&local_30,
                             local_30 + Result->_M_string_length,strictConversion);
  if (CVar1 == conversionOK) {
    std::__cxx11::string::resize((ulong)Result,(char)local_30 - (char)(Result->_M_dataplus)._M_p);
  }
  else {
    Result->_M_string_length = 0;
    *(Result->_M_dataplus)._M_p = '\0';
  }
  return CVar1 == conversionOK;
}

Assistant:

bool convertWideToUTF8(const std::wstring &Source, std::string &Result) {
  if (sizeof(wchar_t) == 1) {
    const UTF8 *Start = reinterpret_cast<const UTF8 *>(Source.data());
    const UTF8 *End =
        reinterpret_cast<const UTF8 *>(Source.data() + Source.size());
    if (!isLegalUTF8String(&Start, End))
      return false;
    Result.resize(Source.size());
    memcpy(&Result[0], Source.data(), Source.size());
    return true;
  } else if (sizeof(wchar_t) == 2) {
    return convertUTF16ToUTF8String(
        llvm::ArrayRef<UTF16>(reinterpret_cast<const UTF16 *>(Source.data()),
                              Source.size()),
        Result);
  } else if (sizeof(wchar_t) == 4) {
    const UTF32 *Start = reinterpret_cast<const UTF32 *>(Source.data());
    const UTF32 *End =
        reinterpret_cast<const UTF32 *>(Source.data() + Source.size());
    Result.resize(UNI_MAX_UTF8_BYTES_PER_CODE_POINT * Source.size());
    UTF8 *ResultPtr = reinterpret_cast<UTF8 *>(&Result[0]);
    UTF8 *ResultEnd = reinterpret_cast<UTF8 *>(&Result[0] + Result.size());
    if (ConvertUTF32toUTF8(&Start, End, &ResultPtr, ResultEnd,
                           strictConversion) == conversionOK) {
      Result.resize(reinterpret_cast<char *>(ResultPtr) - &Result[0]);
      return true;
    } else {
      Result.clear();
      return false;
    }
  } else {
    llvm_unreachable(
        "Control should never reach this point; see static_assert further up");
  }
}